

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool GlobOpt::DoTypedArrayTypeSpec(Func *func)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeProfileInfo *this;
  byte local_19;
  byte local_11;
  Func *func_local;
  
  sourceContextId = Func::GetSourceContextId(func);
  functionId = Func::GetLocalFunctionId(func);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,TypedArrayTypeSpecPhase,sourceContextId,functionId);
  local_11 = 0;
  if (!bVar1) {
    bVar1 = IsTypeSpecPhaseOff(func);
    local_11 = 0;
    if (!bVar1) {
      bVar1 = Func::HasProfileInfo(func);
      local_19 = 1;
      if (bVar1) {
        this = Func::GetReadOnlyProfileInfo(func);
        bVar1 = Func::IsLoopBody(func);
        bVar1 = JITTimeProfileInfo::IsTypedArrayTypeSpecDisabled(this,bVar1);
        local_19 = bVar1 ^ 0xff;
      }
      local_11 = local_19;
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool
GlobOpt::DoTypedArrayTypeSpec(Func const * func)
{
    return !PHASE_OFF(Js::TypedArrayTypeSpecPhase, func) &&
        !IsTypeSpecPhaseOff(func) &&
        (!func->HasProfileInfo() || !func->GetReadOnlyProfileInfo()->IsTypedArrayTypeSpecDisabled(func->IsLoopBody()))
#if defined(_M_IX86)
        && AutoSystemInfo::Data.SSE2Available()
#endif
        ;
}